

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_vector3.cxx
# Opt level: O0

_vector3<float> * __thiscall xray_re::_vector3<float>::decompress(_vector3<float> *this,uint16_t s)

{
  float fVar1;
  uint local_1c;
  float adj;
  int v;
  int u;
  uint16_t s_local;
  _vector3<float> *this_local;
  
  if ((initialized & 1) == 0) {
    initialize();
  }
  adj = (float)((int)(uint)s >> 7 & 0x3f);
  local_1c = s & 0x7f;
  if (0x7e < (int)adj + local_1c) {
    adj = (float)(0x7f - (int)adj);
    local_1c = 0x7f - local_1c;
  }
  fVar1 = *(float *)(uv_adjustment + (long)(int)(s & 0x1fff) * 4);
  (this->field_0).field_0.x = fVar1 * (float)(int)adj;
  (this->field_0).field_0.y = fVar1 * (float)(int)local_1c;
  (this->field_0).field_0.z = fVar1 * (float)(int)((0x7e - (int)adj) - local_1c);
  if ((s & 0x8000) != 0) {
    (this->field_0).field_0.x = -(this->field_0).field_0.x;
  }
  if ((s & 0x4000) != 0) {
    (this->field_0).field_0.y = -(this->field_0).field_0.y;
  }
  if ((s & 0x2000) != 0) {
    (this->field_0).field_0.z = -(this->field_0).field_0.z;
  }
  return this;
}

Assistant:

_vector3<float>& _vector3<float>::decompress(uint16_t s)
{
	if (!initialized)
		initialize();

	int u = (s >> 7) & 0x3f;
	int v = s & 0x7f;
	if (u + v >= 127) {
		u = 127 - u;
		v = 127 - v;
	}
	float adj = uv_adjustment[s & 0x1fff];
	x = adj * u;
	y = adj * v;
	z = adj * (126 - u - v);
	if (s & 0x8000)
		x = -x;
	if (s & 0x4000)
		y = -y;
	if (s & 0x2000)
		z = -z;
	return *this;
}